

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_check_key_curve(mbedtls_pk_context *pk,mbedtls_ecp_curve_info **curves)

{
  mbedtls_ecp_keypair *pmVar1;
  mbedtls_ecp_curve_info **ppmStack_28;
  mbedtls_ecp_group_id grp_id;
  mbedtls_ecp_curve_info **crv;
  mbedtls_ecp_curve_info **curves_local;
  mbedtls_pk_context *pk_local;
  
  pmVar1 = mbedtls_pk_ec(*pk);
  ppmStack_28 = curves;
  while( true ) {
    if (*ppmStack_28 == (mbedtls_ecp_curve_info *)0x0) {
      return -1;
    }
    if ((*ppmStack_28)->grp_id == (pmVar1->grp).id) break;
    ppmStack_28 = ppmStack_28 + 1;
  }
  return 0;
}

Assistant:

static int ssl_check_key_curve( mbedtls_pk_context *pk,
                                const mbedtls_ecp_curve_info **curves )
{
    const mbedtls_ecp_curve_info **crv = curves;
    mbedtls_ecp_group_id grp_id = mbedtls_pk_ec( *pk )->grp.id;

    while( *crv != NULL )
    {
        if( (*crv)->grp_id == grp_id )
            return( 0 );
        crv++;
    }

    return( -1 );
}